

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

result __thiscall
dtc::anon_unknown_1::divmod<std::modulus<unsigned_long_long>_>::operator()
          (divmod<std::modulus<unsigned_long_long>_> *this)

{
  int iVar1;
  type peVar2;
  undefined4 extraout_var;
  byte extraout_DL;
  undefined8 extraout_RDX;
  result rVar3;
  result rVar4;
  bool local_45;
  int local_44;
  long local_40;
  long local_30;
  result r;
  divmod<std::modulus<unsigned_long_long>_> *this_local;
  bool local_10;
  
  r._8_8_ = this;
  peVar2 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&(this->super_binary_operator<5,_std::modulus<unsigned_long_long>_>).
                        super_binary_operator_base.rhs);
  iVar1 = (**peVar2->_vptr_expression)();
  local_40 = CONCAT44(extraout_var,iVar1);
  local_30 = local_40;
  if (((extraout_DL & 1) == 0) || (local_40 != 0)) {
    rVar3 = binary_operator<5,_std::modulus<unsigned_long_long>_>::operator()
                      (&this->super_binary_operator<5,_std::modulus<unsigned_long_long>_>);
    local_10 = rVar3.second;
  }
  else {
    text_input_buffer::source_location::report_error
              (&(this->super_binary_operator<5,_std::modulus<unsigned_long_long>_>).
                super_binary_operator_base.super_expression.loc,"Division by zero");
    local_44 = 0;
    local_45 = false;
    std::pair<unsigned_long_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long_long,_bool> *)&this_local,&local_44,&local_45);
    rVar3._8_8_ = extraout_RDX;
    rVar3.first = (unsigned_long_long)this_local;
  }
  this_local = (divmod<std::modulus<unsigned_long_long>_> *)rVar3.first;
  rVar4._9_7_ = rVar3._9_7_;
  rVar4.second = local_10;
  rVar4.first = (unsigned_long_long)this_local;
  return rVar4;
}

Assistant:

result operator()() override
	{
		result r = (*binary_operator_base::rhs)();
		if (r.second && (r.first == 0))
		{
			expression::loc.report_error("Division by zero");
			return {0, false};
		}
		return binary_operator<5, T>::operator()();
	}